

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O0

void __thiscall
chrono::robosimian::RS_Limb::Activate(RS_Limb *this,string *motor_name,double time,double val)

{
  bool bVar1;
  ostream *poVar2;
  pointer ppVar3;
  element_type *peVar4;
  ChLinkMotor local_58 [16];
  undefined1 local_48 [8];
  shared_ptr<chrono::ChFunction_Setpoint> fun;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>,_true>
  local_30;
  iterator itr;
  double val_local;
  double time_local;
  string *motor_name_local;
  RS_Limb *this_local;
  
  itr.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>,_true>
               )val;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>_>_>
       ::find(&this->m_motors,motor_name);
  fun.super___shared_ptr<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>_>_>
         ::end(&this->m_motors);
  bVar1 = std::__detail::operator==
                    (&local_30,
                     (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>,_true>
                      *)&fun.
                         super___shared_ptr<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Limb::Activate -- Unknown motor ");
    poVar2 = std::operator<<(poVar2,(string *)motor_name);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>,_false,_true>
                           *)&local_30);
    std::__shared_ptr_access<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&ppVar3->second);
    ChLinkMotor::GetMotorFunction(local_58);
    std::static_pointer_cast<chrono::ChFunction_Setpoint,chrono::ChFunction>
              ((shared_ptr<chrono::ChFunction> *)local_48);
    std::shared_ptr<chrono::ChFunction>::~shared_ptr((shared_ptr<chrono::ChFunction> *)local_58);
    peVar4 = std::
             __shared_ptr_access<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_48);
    (**(code **)(*(long *)peVar4 + 0xd0))
              ((ulong)itr.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>,_true>
                      ._M_cur ^ 0x8000000000000000,time);
    std::shared_ptr<chrono::ChFunction_Setpoint>::~shared_ptr
              ((shared_ptr<chrono::ChFunction_Setpoint> *)local_48);
  }
  return;
}

Assistant:

void RS_Limb::Activate(const std::string& motor_name, double time, double val) {
    auto itr = m_motors.find(motor_name);
    if (itr == m_motors.end()) {
        std::cout << "Limb::Activate -- Unknown motor " << motor_name << std::endl;
        return;
    }

    // Note: currently hard-coded for angle motor
    auto fun = std::static_pointer_cast<ChFunction_Setpoint>(itr->second->GetMotorFunction());
    fun->SetSetpoint(-val, time);
}